

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRngPErrMemory(xmlRelaxNGParserCtxtPtr ctxt)

{
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  
  if (ctxt == (xmlRelaxNGParserCtxtPtr)0x0) {
    schannel = (xmlStructuredErrorFunc)0x0;
    channel = (xmlGenericErrorFunc)0x0;
    data = (void *)0x0;
  }
  else {
    schannel = ctxt->serror;
    if (schannel == (xmlStructuredErrorFunc)0x0) {
      channel = ctxt->error;
    }
    else {
      channel = (xmlGenericErrorFunc)0x0;
    }
    data = ctxt->userData;
    ctxt->nbErrors = ctxt->nbErrors + 1;
  }
  xmlRaiseMemoryError(schannel,channel,data,0x12,(xmlError *)0x0);
  return;
}

Assistant:

static void
xmlRngPErrMemory(xmlRelaxNGParserCtxtPtr ctxt)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data = NULL;

    if (ctxt != NULL) {
        if (ctxt->serror != NULL)
	    schannel = ctxt->serror;
	else
	    channel = ctxt->error;
        data = ctxt->userData;
        ctxt->nbErrors++;
    }

    xmlRaiseMemoryError(schannel, channel, data, XML_FROM_RELAXNGP, NULL);
}